

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhjfilter.cpp
# Opt level: O2

void __thiscall
Uhj2Encoder::encode(Uhj2Encoder *this,FloatBufferLine *LeftOut,FloatBufferLine *RightOut,
                   FloatBufferLine *InSamples,size_t SamplesToDo)

{
  array<float,_1152UL> *__dest;
  size_t i;
  long lVar1;
  size_t sVar2;
  float *pfVar3;
  undefined1 *puVar4;
  float *pfVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  array<float,_1280UL> *__dest_00;
  float *pfVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  
  pfVar9 = InSamples[1]._M_elems;
  memcpy(&this->mMid,this,0x200);
  lVar7 = SamplesToDo * 4;
  lVar1 = 0;
  pfVar3 = InSamples->_M_elems;
  pfVar5 = pfVar9;
  for (; lVar7 - lVar1 != 0; lVar1 = lVar1 + 4) {
    *(float *)((long)(this->mMid)._M_elems + lVar1 + 0x200) =
         *pfVar3 * 0.9396926 + *pfVar5 * 0.185574;
    pfVar3 = pfVar3 + 1;
    pfVar5 = pfVar5 + 1;
  }
  __dest = &this->mSide;
  memcpy(__dest,&this->mSideDelay,0x200);
  for (lVar1 = 0; lVar7 - lVar1 != 0; lVar1 = lVar1 + 4) {
    *(float *)((long)(this->mSide)._M_elems + lVar1 + 0x200) =
         *(float *)((long)InSamples[2]._M_elems + lVar1) * 0.6554516;
  }
  for (sVar2 = 0; SamplesToDo != sVar2; sVar2 = sVar2 + 1) {
    (this->mMid)._M_elems[sVar2 + 0x80] =
         LeftOut->_M_elems[sVar2] + RightOut->_M_elems[sVar2] + (this->mMid)._M_elems[sVar2 + 0x80];
  }
  for (sVar2 = 0; SamplesToDo != sVar2; sVar2 = sVar2 + 1) {
    (this->mSide)._M_elems[sVar2 + 0x80] =
         (LeftOut->_M_elems[sVar2] - RightOut->_M_elems[sVar2]) +
         (this->mSide)._M_elems[sVar2 + 0x80];
  }
  memmove(this,(this->mMid)._M_elems + SamplesToDo,0x200);
  memmove(&this->mSideDelay,__dest->_M_elems + SamplesToDo,0x200);
  __dest_00 = &this->mTemp;
  memcpy(__dest_00,&this->mSideHistory,0x3fc);
  for (lVar1 = 0; lVar7 - lVar1 != 0; lVar1 = lVar1 + 4) {
    *(float *)((long)(this->mTemp)._M_elems + lVar1 + 0x3fc) =
         InSamples->_M_elems[0] * -0.3420201 + *pfVar9 * 0.5098604;
    InSamples = (FloatBufferLine *)((long)InSamples + 4);
    pfVar9 = pfVar9 + 1;
  }
  memmove(&this->mSideHistory,__dest_00->_M_elems + SamplesToDo,0x3fc);
  if (SamplesToDo < 2) {
    lVar1 = 0;
  }
  else {
    uVar6 = SamplesToDo >> 1;
    lVar7 = 0;
    do {
      fVar10 = 0.0;
      fVar11 = 0.0;
      fVar12 = 0.0;
      fVar13 = 0.0;
      puVar4 = (anonymous_namespace)::PShiftCoeffs;
      fVar14 = 0.0;
      fVar15 = 0.0;
      fVar16 = 0.0;
      fVar17 = 0.0;
      for (uVar8 = 0; uVar8 < 0x80; uVar8 = uVar8 + 4) {
        pfVar3 = __dest_00->_M_elems + uVar8 * 2;
        pfVar9 = __dest_00->_M_elems + uVar8 * 2 + 4;
        fVar14 = fVar14 + *pfVar3 * *(float *)puVar4;
        fVar15 = fVar15 + pfVar3[2] * *(float *)((long)puVar4 + 4);
        fVar16 = fVar16 + *pfVar9 * *(float *)((long)puVar4 + 8);
        fVar17 = fVar17 + pfVar9[2] * *(float *)((long)puVar4 + 0xc);
        fVar10 = fVar10 + pfVar3[1] * *(float *)puVar4;
        fVar11 = fVar11 + pfVar3[3] * *(float *)((long)puVar4 + 4);
        fVar12 = fVar12 + pfVar9[1] * *(float *)((long)puVar4 + 8);
        fVar13 = fVar13 + pfVar9[3] * *(float *)((long)puVar4 + 0xc);
        puVar4 = (undefined1 *)((long)puVar4 + 0x10);
      }
      lVar1 = lVar7 + 2;
      *(ulong *)(__dest->_M_elems + lVar7) =
           CONCAT44(fVar13 + fVar10 + fVar11 + fVar12 +
                    (float)((ulong)*(undefined8 *)(__dest->_M_elems + lVar7) >> 0x20),
                    fVar17 + fVar14 + fVar15 + fVar16 +
                    (float)*(undefined8 *)(__dest->_M_elems + lVar7));
      __dest_00 = (array<float,_1280UL> *)(__dest_00->_M_elems + 2);
      uVar6 = uVar6 - 1;
      lVar7 = lVar1;
    } while (uVar6 != 0);
  }
  if ((SamplesToDo & 1) != 0) {
    fVar10 = 0.0;
    fVar11 = 0.0;
    fVar12 = 0.0;
    fVar13 = 0.0;
    puVar4 = (anonymous_namespace)::PShiftCoeffs;
    for (uVar6 = 0; uVar6 < 0x80; uVar6 = uVar6 + 4) {
      fVar10 = fVar10 + __dest_00->_M_elems[uVar6 * 2] * *(float *)puVar4;
      fVar11 = fVar11 + __dest_00->_M_elems[uVar6 * 2 + 2] * *(float *)((long)puVar4 + 4);
      fVar12 = fVar12 + __dest_00->_M_elems[uVar6 * 2 + 4] * *(float *)((long)puVar4 + 8);
      fVar13 = fVar13 + __dest_00->_M_elems[uVar6 * 2 + 6] * *(float *)((long)puVar4 + 0xc);
      puVar4 = (undefined1 *)((long)puVar4 + 0x10);
    }
    __dest->_M_elems[lVar1] = fVar11 + fVar12 + fVar13 + fVar10 + __dest->_M_elems[lVar1];
  }
  for (sVar2 = 0; SamplesToDo != sVar2; sVar2 = sVar2 + 1) {
    LeftOut->_M_elems[sVar2] = ((this->mMid)._M_elems[sVar2] + __dest->_M_elems[sVar2]) * 0.5;
  }
  for (sVar2 = 0; SamplesToDo != sVar2; sVar2 = sVar2 + 1) {
    RightOut->_M_elems[sVar2] = ((this->mMid)._M_elems[sVar2] - __dest->_M_elems[sVar2]) * 0.5;
  }
  return;
}

Assistant:

void Uhj2Encoder::encode(FloatBufferLine &LeftOut, FloatBufferLine &RightOut,
    const FloatBufferLine *InSamples, const size_t SamplesToDo)
{
    ASSUME(SamplesToDo > 0);

    float *RESTRICT left{al::assume_aligned<16>(LeftOut.data())};
    float *RESTRICT right{al::assume_aligned<16>(RightOut.data())};

    const float *RESTRICT winput{al::assume_aligned<16>(InSamples[0].data())};
    const float *RESTRICT xinput{al::assume_aligned<16>(InSamples[1].data())};
    const float *RESTRICT yinput{al::assume_aligned<16>(InSamples[2].data())};

    /* Combine the previously delayed mid/side signal with the input. */

    /* S = 0.9396926*W + 0.1855740*X */
    auto miditer = std::copy(mMidDelay.cbegin(), mMidDelay.cend(), mMid.begin());
    std::transform(winput, winput+SamplesToDo, xinput, miditer,
        [](const float w, const float x) noexcept -> float
        { return 0.9396926f*w + 0.1855740f*x; });

    /* D = 0.6554516*Y */
    auto sideiter = std::copy(mSideDelay.cbegin(), mSideDelay.cend(), mSide.begin());
    std::transform(yinput, yinput+SamplesToDo, sideiter,
        [](const float y) noexcept -> float { return 0.6554516f*y; });

    /* Include any existing direct signal in the mid/side buffers. */
    for(size_t i{0};i < SamplesToDo;++i,++miditer)
        *miditer += left[i] + right[i];
    for(size_t i{0};i < SamplesToDo;++i,++sideiter)
        *sideiter += left[i] - right[i];

    /* Copy the future samples back to the delay buffers for next time. */
    std::copy_n(mMid.cbegin()+SamplesToDo, mMidDelay.size(), mMidDelay.begin());
    std::copy_n(mSide.cbegin()+SamplesToDo, mSideDelay.size(), mSideDelay.begin());

    /* Now add the all-passed signal into the side signal. */

    /* D += j(-0.3420201*W + 0.5098604*X) */
    auto tmpiter = std::copy(mSideHistory.cbegin(), mSideHistory.cend(), mTemp.begin());
    std::transform(winput, winput+SamplesToDo, xinput, tmpiter,
        [](const float w, const float x) noexcept -> float
        { return -0.3420201f*w + 0.5098604f*x; });
    std::copy_n(mTemp.cbegin()+SamplesToDo, mSideHistory.size(), mSideHistory.begin());
    allpass_process({mSide.data(), SamplesToDo}, mTemp.data());

    /* Left = (S + D)/2.0 */
    for(size_t i{0};i < SamplesToDo;i++)
        left[i] = (mMid[i] + mSide[i]) * 0.5f;
    /* Right = (S - D)/2.0 */
    for(size_t i{0};i < SamplesToDo;i++)
        right[i] = (mMid[i] - mSide[i]) * 0.5f;
}